

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<char,short>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  short sVar2;
  int iVar3;
  int local_3c;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_35;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  short u;
  
  u = 0;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>(&local_35,&u);
  su.m_int = u;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>(&st2,&su);
  local_35.m_int = '\0';
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,&u);
  SafeCastHelper<char,_short,_4>::CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (su.m_int,(char *)&local_35);
  local_35.m_int = st2.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*(&local_35,st2);
  operator*(u,local_35);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,su);
  u = 1;
  iVar3 = 1;
  local_3c = iVar3;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,
             &local_3c);
  local_3c = iVar3;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_3c);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  local_3c = iVar3;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_3c);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%(&local_35,st2);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,su);
  u = 1;
  local_3c = iVar3;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_3c);
  local_3c = iVar3;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,
             &local_3c);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/(&local_35,st2);
  operator/(u,local_35);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,su);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+(&local_35,st2);
  operator+(u,local_35);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,su);
  local_3c = 0;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,
             &local_3c);
  u = 0;
  local_3c = 0;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,&local_3c);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-(&local_35,st2);
  operator-(u,local_35);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  local_3c = iVar3;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,
             &local_3c);
  local_3c = iVar3;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_3c);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,su);
  u = 1;
  local_3c = iVar3;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_3c);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SVar1 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                    ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35
                     ,su);
  operator<<(SVar1.m_int,su);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,su);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SVar1 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                    ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35
                     ,su);
  operator>>(SVar1.m_int,su);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_35,su);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_35,st2);
  sVar2 = BinaryAndHelper<short,_char,_1>::And(su.m_int,local_35.m_int & (byte)u);
  local_3c._0_2_ = sVar2;
  SafeInt::operator_cast_to_char((SafeInt *)&local_3c);
  local_35.m_int = (byte)su.m_int & (byte)u & local_35.m_int & st2.m_int;
  local_3c._0_2_ = BinaryOrHelper<short,_char,_1>::Or(su.m_int,(byte)u);
  SafeInt::operator_cast_to_char((SafeInt *)&local_3c);
  local_35.m_int = (byte)su.m_int | (byte)u | local_35.m_int | st2.m_int;
  sVar2 = BinaryXorHelper<short,_char,_1>::Xor(su.m_int,local_35.m_int ^ (byte)u);
  local_3c = CONCAT22(local_3c._2_2_,sVar2);
  SafeInt::operator_cast_to_char((SafeInt *)&local_3c);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}